

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

table * util::getTable(string *name,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                      *table_list)

{
  table *ptVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>
  tl;
  string tl_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>
  local_78;
  string local_50;
  
  p_Var3 = (table_list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(table_list->_M_t)._M_impl.super__Rb_tree_header) {
      return (table *)0x0;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>
    ::pair(&local_78,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>
            *)(p_Var3 + 1));
    std::__cxx11::string::string((string *)&local_50,(string *)&local_78);
    bVar2 = compareString(name,&local_50);
    ptVar1 = local_78.second;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) break;
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  }
  return ptVar1;
}

Assistant:

table* util::getTable(const string &name, map<string, table*> table_list){
    for(auto tl : table_list){
        //cout << tl.first << endl;
        string tl_name = tl.first;
        if(compareString(name, tl_name))
            return tl.second;
    }
    return nullptr;
}